

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setTester(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *x,bool destroy)

{
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (this->freeRatioTester == true) {
    if (this->theratiotester !=
        (SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      (*this->theratiotester->_vptr_SPxRatioTester[0xb])();
    }
    this->theratiotester =
         (SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
  }
  this->theratiotester = x;
  if (x != (SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0) {
    if (this->initialized == true) {
      (*x->_vptr_SPxRatioTester[1])(x,this);
    }
    else {
      (*x->_vptr_SPxRatioTester[2])(x);
    }
    pSVar1 = this->theratiotester;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    (*pSVar1->_vptr_SPxRatioTester[6])(pSVar1,&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  this->freeRatioTester = destroy;
  return;
}

Assistant:

void SPxSolverBase<R>::setTester(SPxRatioTester<R>* x, const bool destroy)
{
   assert(!freeRatioTester || theratiotester != nullptr);

   if(freeRatioTester)
   {
      delete theratiotester;
      theratiotester = nullptr;
   }

   theratiotester = x;

   // set the solver pointer inside the ratiotester
   if(theratiotester != nullptr)
   {
      if(isInitialized())
         theratiotester->load(this);
      else
         theratiotester->clear();

      theratiotester->setTolerances(this->tolerances());
   }

   freeRatioTester = destroy;
}